

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void PrintEthernetPhyStatusV3(AmpIO *Board,uint chan)

{
  uint16_t uVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  undefined8 *puVar8;
  uint16_t reg;
  uint16_t coreReg;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"PHY");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,":");
  bVar2 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1a,&reg);
  if (bVar2) {
    if ((reg & 4) != 0) {
      std::operator<<((ostream *)&std::cout," link-good");
    }
    pcVar7 = " full-duplex";
    if ((reg & 8) == 0) {
      pcVar7 = " half-duplex";
    }
    std::operator<<((ostream *)&std::cout,pcVar7);
    uVar1 = reg;
    poVar3 = std::operator<<((ostream *)&std::cout," ");
    puVar8 = (undefined8 *)&DAT_001255c0;
    std::operator<<(poVar3,*(char **)(&DAT_001255c0 + (uVar1 >> 1 & 0x18)));
    if ((reg & 2) != 0) {
      std::operator<<((ostream *)&std::cout," polarity-reversed");
    }
    poVar3 = (ostream *)&std::cout;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"Reading GMII core register: ");
    bVar2 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,8,0x10,&coreReg);
    if (bVar2) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      plVar4 = (long *)std::ostream::operator<<(&std::cout,coreReg);
      *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) =
           *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 2) {
        if ((coreReg & 0x2040) == *(ushort *)((long)&DAT_001190c0 + lVar6)) {
          poVar3 = (ostream *)&std::cout;
          poVar5 = std::operator<<((ostream *)&std::cout,", Speed: ");
          std::operator<<(poVar5,(char *)*puVar8);
          break;
        }
        puVar8 = puVar8 + 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout," failed to read to GMII core register");
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout," failed to read PHYSR");
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void PrintEthernetPhyStatusV3(AmpIO &Board, unsigned int chan)
{
    std::cout << "PHY" << chan << ":";
    uint16_t reg;
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
    // This should be on page 0xa43, but seems to work fine on default page
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYSR, reg)) {
        std::cout << " failed to read PHYSR" << std::endl;
        return;
    }
    if (reg & 0x0004) std::cout << " link-good";
    if (reg & 0x0008) std::cout << " full-duplex";
    else std::cout << " half-duplex";
    unsigned int speed = (reg & 0x0030)>>4;
    const char *speedStr[4] = { "10Mbps", "100 Mbps", "1000 Mbps", "??" };
    std::cout << " " << speedStr[speed];
    if (reg & 0x0002) std::cout << " polarity-reversed";
    std::cout << std::endl;

    // Speed setting uses bits 6 and 13, as follows:
    //
    //   speed | Mbps | 6,13  | register value
    //     0   |   10 | 0, 0  |     0x0000
    //     1   |  100 | 0, 1  |     0x2000
    //     2   | 1000 | 1, 0  |     0x0040
    //     3   |   ?? | 1, 1  |     0x2040
    unsigned short speedMap[4] = { 0x0000, 0x2000, 0x0040, 0x2040 };
    std::cout << "Reading GMII core register: ";
    uint16_t coreReg;
    if (Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, coreReg)) {
        std::cout << std::hex << coreReg << std::dec;
        for (size_t i = 0; i < 4; i++) {
            if ((coreReg&0x2040) == speedMap[i]) {
                std::cout << ", Speed: " << speedStr[i];
                break;
            }
        }
        std::cout << std::endl;
    }
    else {
        std::cout << " failed to read to GMII core register" << std::endl;
    }
}